

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O1

void renameWalkWith(Walker *pWalker,Select *pSelect)

{
  With *p;
  Parse *pParse;
  Select *p_00;
  With *pWVar1;
  Select **ppSVar2;
  long lVar3;
  NameContext sNC;
  NameContext local_68;
  
  p = pSelect->pWith;
  if (p != (With *)0x0) {
    pParse = pWalker->pParse;
    if (((p->a[0].pSelect)->selFlags & 0x40) == 0) {
      pWVar1 = sqlite3WithDup(pParse->db,p);
      pWVar1 = sqlite3WithPush(pParse,pWVar1,'\x01');
    }
    else {
      pWVar1 = (With *)0x0;
    }
    if (0 < p->nCte) {
      ppSVar2 = &p->a[0].pSelect;
      lVar3 = 0;
      do {
        p_00 = *ppSVar2;
        local_68.pSrcList = (SrcList *)0x0;
        local_68.nRef = 0;
        local_68.nNcErr = 0;
        local_68.ncFlags = 0;
        local_68._44_4_ = 0;
        local_68.uNC.pEList = (ExprList *)0x0;
        local_68.pNext = (NameContext *)0x0;
        local_68.pWinSelect = (Select *)0x0;
        local_68.pParse = pParse;
        if (pWVar1 != (With *)0x0) {
          sqlite3SelectPrep(pParse,p_00,&local_68);
        }
        if ((local_68.pParse)->db->mallocFailed != '\0') {
          return;
        }
        sqlite3WalkSelect(pWalker,p_00);
        sqlite3RenameExprlistUnmap(pParse,(ExprList *)ppSVar2[-1]);
        lVar3 = lVar3 + 1;
        ppSVar2 = ppSVar2 + 6;
      } while (lVar3 < p->nCte);
    }
    if ((pWVar1 != (With *)0x0) && (pParse->pWith == pWVar1)) {
      pParse->pWith = pWVar1->pOuter;
    }
  }
  return;
}

Assistant:

static void renameWalkWith(Walker *pWalker, Select *pSelect){
  With *pWith = pSelect->pWith;
  if( pWith ){
    Parse *pParse = pWalker->pParse;
    int i;
    With *pCopy = 0;
    assert( pWith->nCte>0 );
    if( (pWith->a[0].pSelect->selFlags & SF_Expanded)==0 ){
      /* Push a copy of the With object onto the with-stack. We use a copy
      ** here as the original will be expanded and resolved (flags SF_Expanded
      ** and SF_Resolved) below. And the parser code that uses the with-stack
      ** fails if the Select objects on it have already been expanded and
      ** resolved.  */
      pCopy = sqlite3WithDup(pParse->db, pWith);
      pCopy = sqlite3WithPush(pParse, pCopy, 1);
    }
    for(i=0; i<pWith->nCte; i++){
      Select *p = pWith->a[i].pSelect;
      NameContext sNC;
      memset(&sNC, 0, sizeof(sNC));
      sNC.pParse = pParse;
      if( pCopy ) sqlite3SelectPrep(sNC.pParse, p, &sNC);
      if( sNC.pParse->db->mallocFailed ) return;
      sqlite3WalkSelect(pWalker, p);
      sqlite3RenameExprlistUnmap(pParse, pWith->a[i].pCols);
    }
    if( pCopy && pParse->pWith==pCopy ){
      pParse->pWith = pCopy->pOuter;
    }
  }
}